

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_set.cpp
# Opt level: O2

void check_set(flag_set<test_flags> *set,bool a,bool b,bool c)

{
  Flags FVar1;
  flag local_344 [4];
  SourceLineInfo local_340;
  BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&> local_330;
  AssertionHandler catchAssertionHandler;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x20;
  Catch::StringRef::StringRef(&local_40,"set.is_set(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_40,Normal);
  local_340.file = (char *)(CONCAT71(local_340.file._1_7_,(set->flags_).bits_) & 0xffffffffffffff01)
  ;
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_330,(ExprLhs<bool> *)&local_340,a);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x21;
  Catch::StringRef::StringRef(&local_50,"set.as_flag(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_50,Normal);
  local_344[0].state_ = (bool)((set->flags_).bits_ & 1);
  local_340.file = &local_344[0].state_;
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            ((BinaryExpr<const_type_safe::flag_&,_bool> *)&local_330,
             (ExprLhs<const_type_safe::flag_&> *)&local_340,a);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if (a) {
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x23;
    Catch::StringRef::StringRef(&local_60,"(set & test_flags::a)");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_60,Normal);
    local_330.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                   (set->flags_).bits_) & 0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x25;
  Catch::StringRef::StringRef(&local_70,"set.is_set(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_70,Normal);
  local_340.file =
       (char *)(CONCAT71(local_340.file._1_7_,(set->flags_).bits_ >> 1) & 0xffffffffffffff01);
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_330,(ExprLhs<bool> *)&local_340,b);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x26;
  Catch::StringRef::StringRef(&local_80,"set.as_flag(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_80,Normal);
  local_344[0].state_ = (bool)((set->flags_).bits_ >> 1 & 1);
  local_340.file = &local_344[0].state_;
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            ((BinaryExpr<const_type_safe::flag_&,_bool> *)&local_330,
             (ExprLhs<const_type_safe::flag_&> *)&local_340,b);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if (b) {
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x28;
    Catch::StringRef::StringRef(&local_90,"(set & test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_90,Normal);
    local_330.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                   (set->flags_).bits_ >> 1) & 0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x2a;
  Catch::StringRef::StringRef(&local_a0,"set.is_set(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_a0,Normal);
  local_340.file =
       (char *)(CONCAT71(local_340.file._1_7_,(set->flags_).bits_ >> 2) & 0xffffffffffffff01);
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_330,(ExprLhs<bool> *)&local_340,c);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x2b;
  Catch::StringRef::StringRef(&local_b0,"set.as_flag(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_b0,Normal);
  local_344[0].state_ = (bool)((set->flags_).bits_ >> 2 & 1);
  local_340.file = &local_344[0].state_;
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            ((BinaryExpr<const_type_safe::flag_&,_bool> *)&local_330,
             (ExprLhs<const_type_safe::flag_&> *)&local_340,c);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if (c) {
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x2d;
    Catch::StringRef::StringRef(&local_c0,"(set & test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_c0,Normal);
    local_330.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                   (set->flags_).bits_ >> 2) & 0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  else if (!a && !b) {
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c73d0;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x38;
    Catch::StringRef::StringRef(&local_110,"set.any()");
    FVar1 = Catch::operator|(Normal,FalseTest);
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_110,FVar1);
    local_330.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)
         CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                  (set->flags_).bits_ != '\0');
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x39;
    Catch::StringRef::StringRef(&local_120,"set.none()");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_120,Normal);
    local_330.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)
         CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                  (set->flags_).bits_ == '\0');
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x3a;
    Catch::StringRef::StringRef(&local_130,"set == type_safe::noflag");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_130,Normal);
    local_340.file = (char *)set;
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              ((BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&> *)
               &local_330,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_340,
               (noflag_t *)&type_safe::noflag);
    Catch::AssertionHandler::handleExpr
              (&catchAssertionHandler,&local_330.super_ITransientExpression);
    Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_330.super_ITransientExpression.m_isBinaryExpression = true;
    local_330.super_ITransientExpression.m_result = false;
    local_330.super_ITransientExpression._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x3b;
    Catch::StringRef::StringRef(&local_140,"type_safe::noflag == set");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_140,Normal);
    local_340.file = "";
    Catch::ExprLhs<type_safe::noflag_t_const&>::operator==
              (&local_330,(ExprLhs<type_safe::noflag_t_const&> *)&local_340,set);
    Catch::AssertionHandler::handleExpr
              (&catchAssertionHandler,&local_330.super_ITransientExpression);
    Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    (*(code *)(&DAT_001c724c +
              *(int *)(&DAT_001c724c + (ulong)((uint)a * 4 + (uint)b * 2 | (uint)c) * 4)))();
    return;
  }
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x31;
  Catch::StringRef::StringRef(&local_d0,"set.any()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_d0,Normal);
  local_330.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (set->flags_).bits_ != '\0');
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c73d0;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x32;
  Catch::StringRef::StringRef(&local_e0,"set.none()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_e0,FVar1);
  local_330.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_330.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (set->flags_).bits_ == '\0');
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_330);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x33;
  Catch::StringRef::StringRef(&local_f0,"set != type_safe::noflag");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_f0,Normal);
  local_340.file = (char *)set;
  Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator!=
            ((BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&> *)
             &local_330,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_340,
             (noflag_t *)&type_safe::noflag);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_330.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_330.super_ITransientExpression.m_isBinaryExpression = true;
  local_330.super_ITransientExpression.m_result = false;
  local_330.super_ITransientExpression._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x34;
  Catch::StringRef::StringRef(&local_100,"type_safe::noflag != set");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_330,&local_340,local_100,Normal);
  local_340.file = "";
  Catch::ExprLhs<type_safe::noflag_t_const&>::operator!=
            (&local_330,(ExprLhs<type_safe::noflag_t_const&> *)&local_340,set);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_330.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_330.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(code *)(&DAT_001c724c +
            *(int *)(&DAT_001c724c + (ulong)((uint)a * 4 + (uint)b * 2 | (uint)c) * 4)))();
  return;
}

Assistant:

void check_set(const type_safe::flag_set<test_flags>& set, bool a, bool b, bool c)
{
    REQUIRE(set.is_set(test_flags::a) == a);
    REQUIRE(set.as_flag(test_flags::a) == a);
    if (a)
        REQUIRE((set & test_flags::a));

    REQUIRE(set.is_set(test_flags::b) == b);
    REQUIRE(set.as_flag(test_flags::b) == b);
    if (b)
        REQUIRE((set & test_flags::b));

    REQUIRE(set.is_set(test_flags::c) == c);
    REQUIRE(set.as_flag(test_flags::c) == c);
    if (c)
        REQUIRE((set & test_flags::c));

    if (a || b || c)
    {
        REQUIRE(set.any());
        REQUIRE_FALSE(set.none());
        REQUIRE(set != type_safe::noflag);
        REQUIRE(type_safe::noflag != set);
    }
    else
    {
        REQUIRE_FALSE(set.any());
        REQUIRE(set.none());
        REQUIRE(set == type_safe::noflag);
        REQUIRE(type_safe::noflag == set);
    }

    auto number = (a ? 4 : 0) + (b ? 2 : 0) + (c ? 1 : 0);
    switch (number)
    {
    case 0:
        REQUIRE(set == type_safe::flag_set<test_flags>());
        break;
    case 1:
        REQUIRE(set == test_flags::c);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::b));
        REQUIRE((set & test_flags::c));
        break;
    case 2:
        REQUIRE(set == test_flags::b);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::c));
        REQUIRE((set & test_flags::b));
        break;
    case 3:
        REQUIRE(set == (test_flags::b | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::a));
        REQUIRE((set & (test_flags::b | test_flags::c)));
        break;
    case 4:
        REQUIRE(set == test_flags::a);
        REQUIRE(set == type_safe::combo(~test_flags::b & ~test_flags::c));
        REQUIRE((set & test_flags::a));
        break;
    case 5:
        REQUIRE(set == (test_flags::a | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::b));
        REQUIRE((set & (test_flags::a | test_flags::c)));
        break;
    case 6:
        REQUIRE(set == (test_flags::a | test_flags::b));
        REQUIRE(set == type_safe::combo(~test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b)));
        break;
    case 7:
        REQUIRE(set.all());
        REQUIRE(set == (test_flags::a | test_flags::b | test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b | test_flags::c)));
        break;

    default:
        REQUIRE(false);
        break;
    }
}